

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArgMinMaxNBind<duckdb::LessThan>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  PhysicalType PVar2;
  pointer puVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pEVar6;
  reference pvVar7;
  code *pcVar8;
  ParameterNotResolvedException *this_00;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  code *pcVar13;
  pointer this_01;
  LogicalType local_40;
  
  puVar3 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar3; this_01 = this_01 + 1
      ) {
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_01);
    if ((pEVar6->return_type).id_ == UNKNOWN) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  PVar1 = (pEVar6->return_type).physical_type_;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  PVar2 = (pEVar6->return_type).physical_type_;
  switch(PVar1) {
  case INT32:
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
    break;
  case UINT64:
  case UINT64|UINT8:
code_r0x00d603e8:
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
    break;
  case INT64:
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
    break;
  case FLOAT:
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
    break;
  case DOUBLE:
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
    break;
  default:
    if (PVar1 != VARCHAR) goto code_r0x00d603e8;
    switch(PVar2) {
    case INT32:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
      ;
      break;
    case INT64:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::LessThan>>
      ;
      break;
    case FLOAT:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
      ;
      break;
    case DOUBLE:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
      ;
      break;
    default:
      if (PVar2 == VARCHAR) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
        ;
        break;
      }
    case UINT64:
    case UINT64|UINT8:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
      ;
    }
  }
  function->state_size = pcVar13;
  function->initialize = pcVar12;
  function->combine = pcVar11;
  function->destructor = pcVar10;
  function->finalize = pcVar9;
  function->update = pcVar8;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  LogicalType::LIST(&local_40,&pEVar6->return_type);
  (function->super_BaseScalarFunction).return_type.id_ = local_40.id_;
  (function->super_BaseScalarFunction).return_type.physical_type_ = local_40.physical_type_;
  peVar4 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  LogicalType::~LogicalType(&local_40);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ArgMinMaxNBind(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}

	const auto val_type = arguments[0]->return_type.InternalType();
	const auto arg_type = arguments[1]->return_type.InternalType();

	// Specialize the function based on the input types
	SpecializeArgMinMaxNFunction<COMPARATOR>(val_type, arg_type, function);

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return nullptr;
}